

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O2

string * __thiscall cursespp::App::GetQuitKey_abi_cxx11_(string *__return_storage_ptr__,App *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->quitKey);
  return __return_storage_ptr__;
}

Assistant:

std::string App::GetQuitKey() {
    return this->quitKey;
}